

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t astNode;
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  size_t i_1;
  sysbvm_tuple_t sVar4;
  size_t i;
  ulong uVar5;
  sysbvm_tuple_t local_200;
  sysbvm_tuple_t local_1f8;
  sysbvm_tuple_t sStack_1f0;
  sysbvm_tuple_t local_1e8;
  sysbvm_tuple_t sStack_1e0;
  sysbvm_tuple_t local_1d8;
  sysbvm_tuple_t sStack_1d0;
  sysbvm_tuple_t local_1c8;
  sysbvm_tuple_t sStack_1c0;
  sysbvm_tuple_t local_1b8;
  ulong local_1b0;
  anon_struct_24_3_13565e4c gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord_1;
  sysbvm_stackFrameRecord_t local_168;
  undefined8 local_158;
  sysbvm_tuple_t *local_150;
  sysbvm_stackFrameRecord_t local_148;
  undefined8 local_138;
  anon_struct_136_2_7a050327_for_gcRoots *local_130;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  anon_struct_24_3_13565e4c *local_f0;
  sysbvm_functionCallFrameStack_t callFrameStack;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_f0 = &gcFrame;
  gcFrame.receiver = 0;
  gcFrame.chainedMessage = 0;
  gcFrame.result = 0;
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 3;
  sysbvm_stackFrame_pushRecord(&local_108);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sVar3 = *arguments;
  astNode = *(sysbvm_tuple_t *)(sVar3 + 0x28);
  if (astNode != 0) {
    gcFrame.receiver = sysbvm_interpreter_evaluateASTWithEnvironment(context,astNode,arguments[1]);
    sVar3 = *arguments;
  }
  uVar5 = *(ulong *)(sVar3 + 0x38);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    local_1b0 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  else {
    local_1b0 = 0;
  }
  uVar5 = 0;
  do {
    if (uVar5 == local_1b0) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_108);
      return gcFrame.result;
    }
    uVar1 = *(ulong *)(*arguments + 0x38);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      local_200 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
    }
    else {
      local_200 = 0;
    }
    local_1c8 = 0;
    sStack_1c0 = 0;
    local_1d8 = 0;
    sStack_1d0 = 0;
    local_1e8 = 0;
    sStack_1e0 = 0;
    local_1f8 = 0;
    sStack_1f0 = 0;
    local_1b8 = 0;
    local_168.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_168.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_168._12_4_ = 0;
    local_158 = 10;
    local_150 = &local_200;
    gcFrame.chainedMessage = local_200;
    sysbvm_stackFrame_pushRecord(&local_168);
    sourcePositionRecord_1.previous = (sysbvm_stackFrameRecord_t *)0x0;
    sourcePositionRecord_1.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
    sourcePositionRecord_1.sourcePosition = *(sysbvm_tuple_t *)(local_200 + 0x10);
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord_1);
    uVar1 = *(ulong *)(local_200 + 0x30);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      sVar3 = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
    }
    else {
      sVar3 = 0;
    }
    sStack_1f0 = sysbvm_interpreter_evaluateASTWithEnvironment
                           (context,*(sysbvm_tuple_t *)(local_200 + 0x28),arguments[1]);
    if (astNode == 0) {
      _Var2 = sysbvm_environment_lookSymbolRecursively(context,arguments[1],sStack_1f0,&local_1e8);
      if (_Var2) {
        _Var2 = sysbvm_symbolBinding_isValue(context,local_1e8);
        if (!_Var2) goto LAB_00118c48;
      }
      else {
LAB_00118c48:
        sysbvm_error("Failed to find symbol for message send without receiver.");
      }
      sStack_1e0 = sysbvm_symbolValueBinding_getValue(local_1e8);
LAB_00118c63:
      memset(&callFrameStack,0,0xb0);
      local_148.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_148.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_148._12_4_ = 0;
      local_138 = 0x11;
      local_130 = &callFrameStack.gcRoots;
      sysbvm_stackFrame_pushRecord(&local_148);
      sysbvm_functionCallFrameStack_begin
                (context,&callFrameStack,sStack_1e0,(astNode != 0) + sVar3,0);
      if (astNode != 0) {
        sysbvm_functionCallFrameStack_push(&callFrameStack,gcFrame.receiver);
      }
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        uVar1 = *(ulong *)(local_200 + 0x30);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          sStack_1d0 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar4 * 8);
        }
        else {
          sStack_1d0 = 0;
        }
        local_1c8 = sysbvm_interpreter_evaluateASTWithEnvironment(context,sStack_1d0,arguments[1]);
        sysbvm_functionCallFrameStack_push(&callFrameStack,local_1c8);
      }
      sysbvm_stackFrame_popRecord(&local_148);
      local_1b8 = sysbvm_functionCallFrameStack_finish(context,&callFrameStack);
    }
    else {
      local_1f8 = sysbvm_tuple_getType(context,gcFrame.receiver);
      sStack_1e0 = sysbvm_type_lookupSelector(context,local_1f8,sStack_1f0);
      if (sStack_1e0 != 0) goto LAB_00118c63;
      sStack_1e0 = sysbvm_type_lookupSelector
                             (context,local_1f8,(context->roots).doesNotUnderstandSelector);
      if (sStack_1e0 == 0) {
        sysbvm_error("Message not understood.");
      }
      local_1d8 = sysbvm_array_create(context,sVar3);
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        uVar1 = *(ulong *)(local_200 + 0x30);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          sStack_1d0 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar4 * 8);
        }
        else {
          sStack_1d0 = 0;
        }
        local_1c8 = sysbvm_interpreter_evaluateASTWithEnvironment(context,sStack_1d0,arguments[1]);
        if ((local_1c8 & 0xf) == 0 && local_1c8 != 0) {
          *(sysbvm_tuple_t *)(local_1c8 + 0x10 + sVar4 * 8) = local_1c8;
        }
      }
      sStack_1c0 = sysbvm_message_create
                             (context,sStack_1f0,local_1d8,local_1f8,
                              *(sysbvm_tuple_t *)(local_200 + 0x10));
      local_1b8 = sysbvm_function_applyNoCheck2(context,sStack_1e0,gcFrame.receiver,sStack_1c0);
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord_1);
    sysbvm_stackFrame_popRecord(&local_168);
    gcFrame.result = local_1b8;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageChainNode_t **chainNode = (sysbvm_astMessageChainNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t chainedMessage;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*chainNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*chainNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*chainNode)->receiver, *environment);
        hasReceiver = true;
    }

    size_t chainedMessageCount = sysbvm_array_getSize((*chainNode)->messages);
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessage = sysbvm_array_at((*chainNode)->messages, i);
        gcFrame.result = sysbvm_astMessageChainMessageNode_evaluate(context, gcFrame.chainedMessage, hasReceiver, &gcFrame.receiver, environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}